

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O2

void ex1(void)

{
  ostream *poVar1;
  uint uVar2;
  int iVar3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__x;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  endnodes;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  in;
  allocator_type local_1c2;
  bool local_1c1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ou;
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer pvStack_190;
  pointer local_188;
  pointer local_180;
  pointer pvStack_178;
  pointer local_170;
  pointer local_168;
  pointer pvStack_160;
  pointer local_158;
  pointer local_150;
  pointer piStack_148;
  pointer local_140;
  pointer piStack_138;
  pointer local_130;
  pointer piStack_128;
  pointer local_120;
  pointer piStack_118;
  pointer local_110;
  pointer piStack_108;
  pointer local_100;
  pointer piStack_f8;
  pointer local_e8;
  pointer piStack_e0;
  pointer local_d8;
  pointer piStack_d0;
  pointer local_c8;
  pointer piStack_c0;
  vector<bool,_std::allocator<bool>_> vis;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&in,0xf,(value_type *)local_1a8,(allocator_type *)&vis);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_1a8);
  local_1a8._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(int *)local_1a8);
  local_1a8._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(int *)local_1a8);
  local_1a8._0_4_ = 10;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 9;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 7;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 4;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 6;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_1a8);
  local_1a8._0_4_ = 0xb;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_1a8);
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&ou,0xf,(value_type *)local_1a8,(allocator_type *)&vis);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_1a8);
  local_1a8._0_4_ = 3;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(int *)local_1a8);
  local_1a8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(int *)local_1a8);
  local_1a8._0_4_ = 0xb;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 4;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 5;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 6;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 7;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 9;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_1a8);
  local_1a8._0_4_ = 10;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_198 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&endnodes,0x10,(value_type *)local_1a8,(allocator_type *)&vis);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_1a8);
  local_1a8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(int *)local_1a8);
  local_1a8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,(int *)local_1a8);
  local_1a8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2,(int *)local_1a8);
  local_1a8._0_4_ = 0xc;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 4,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 5,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 7,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 7,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8,(int *)local_1a8);
  local_1a8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 9,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 9,(int *)local_1a8);
  local_1a8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(int *)local_1a8);
  local_1a8._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xc,(int *)local_1a8);
  local_1a8._0_4_ = 8;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 0xd;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xd,(int *)local_1a8);
  local_1a8._0_4_ = 10;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 0xb;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xe,(int *)local_1a8);
  local_1a8._0_4_ = 0xb;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xf,(int *)local_1a8);
  local_1a8._0_4_ = 10;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xf,(int *)local_1a8);
  local_1a8._0_4_ = 0xf;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (in.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(int *)local_1a8);
  local_1a8._0_4_ = 0xe;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 10,(int *)local_1a8);
  local_1a8._0_4_ = 0xf;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            (ou.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0xb,(int *)local_1a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_68,&endnodes);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_88,&in);
  __x = &ou;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,__x);
  local_170 = local_88.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar3 = (int)__x;
  local_1a8._0_8_ = &PTR_DFS_001f3c78;
  local_1a8._8_4_ = 0xc;
  local_198 = local_68.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_190 = local_68.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_188 = local_68.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180 = local_88.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_178 = local_88.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168 = local_48.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pvStack_160 = local_48.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_158 = local_48.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = (pointer)0x0;
  piStack_f8 = (pointer)0x0;
  local_110 = (pointer)0x0;
  piStack_108 = (pointer)0x0;
  local_120 = (pointer)0x0;
  piStack_118 = (pointer)0x0;
  local_130 = (pointer)0x0;
  piStack_128 = (pointer)0x0;
  local_140 = (pointer)0x0;
  piStack_138 = (pointer)0x0;
  local_150 = (pointer)0x0;
  piStack_148 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  piStack_c0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  piStack_d0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  piStack_e0 = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68);
  LengauerTarjan::run((LengauerTarjan *)local_1a8,iVar3);
  local_1c1 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&vis,((long)in.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)in.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18,&local_1c1,&local_1c2);
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)(((long)in.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)in.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"(");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,piStack_108[(int)uVar2]);
    std::operator<<(poVar1,") ");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&vis.super__Bvector_base<std::allocator<bool>_>);
  LengauerTarjan::~LengauerTarjan((LengauerTarjan *)local_1a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&endnodes);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&ou);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&in);
  return;
}

Assistant:

void LengauerTarjan::find_doms() {
	// for (int i = 0; i < preds.size(); i++) {
	//     cout <<"Preds of "<<i<<": ";
	//     for (int j = 0; j < preds[i].size(); j++) {
	//             cout <<preds[i][j]<<", ";
	//     }
	//     cout<<endl;
	// }
	// cout << "Semi ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< semi[i]<<") ";
	// cout<<endl;
	// cout << "vertex ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< vertex[i]<<") ";
	// cout<<endl;
	// cout << "label ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< label[i]<<") ";
	// cout<<endl;
	// cout << "parent ";
	// for (int i = 0; i < in.size(); i++)
	//     cout <<"("<<i <<","<< parent[i]<<") ";
	// cout<<endl;
	// cout <<"count "<<count<<endl;

	std::vector<std::vector<int> > buckets =
			std::vector<std::vector<int> >(in.size(), std::vector<int>());

	for (int i = count; i >= 1; i--) {
		const int w = vertex[i];
		std::vector<int>::iterator it;
		for (it = preds[w].begin(); it != preds[w].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			if (semi[u] < semi[w]) {
				semi[w] = semi[u];
			}
		}
		buckets[vertex[semi[w]]].push_back(w);
		LINK(parent[w], w);
		for (it = buckets[parent[w]].begin(); it != buckets[parent[w]].end(); it++) {
			const int v = *it;
			const int u = EVAL(v);
			idom[v] = (semi[u] < semi[v]) ? u : parent[w];
		}
		buckets[parent[w]].clear();
	}

	for (int i = 1; i <= count; i++) {
		const int w = vertex[i];
		if (idom[w] != vertex[semi[w]]) {
			idom[w] = idom[idom[w]];
		}
	}
	idom[root] = root;

}